

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderRenderTextureFunctionTests.cpp
# Opt level: O2

void vkt::sr::anon_unknown_0::evalTexture2DShadowGrad(ShaderEvalContext *c,TexLookupParams *param_2)

{
  float s;
  float t;
  float lod;
  float fVar1;
  
  fVar1 = c->in[0].m_data[2];
  s = c->in[0].m_data[0];
  t = c->in[0].m_data[1];
  lod = computeLodFromGrad2D(c);
  fVar1 = texture2DShadow(c,fVar1,s,t,lod);
  (c->color).m_data[0] = fVar1;
  return;
}

Assistant:

static void		evalTexture2DShadowGrad			(ShaderEvalContext& c, const TexLookupParams&)		{ c.color.x() = texture2DShadow(c, c.in[0].z(), c.in[0].x(), c.in[0].y(), computeLodFromGrad2D(c)); }